

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV3RotAnimationBlock(Parser *this,Animation *anim)

{
  aiVector3t<float> axis;
  bool bVar1;
  vector<aiQuatKey,_std::allocator<aiQuatKey>_> *this_00;
  aiQuaterniont<float> local_68;
  float local_58;
  undefined1 auStack_54 [4];
  ai_real f;
  aiVector3D v;
  aiQuatKey *key;
  byte local_21;
  uint local_20;
  int iStack_1c;
  bool b;
  uint iIndex;
  int iDepth;
  Animation *anim_local;
  Parser *this_local;
  
  iStack_1c = 0;
  _iIndex = anim;
  anim_local = (Animation *)this;
  do {
    if (*this->filePtr == '*') {
      this->filePtr = this->filePtr + 1;
      local_21 = 0;
      bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_ROT_SAMPLE",0x12);
      if (bVar1) {
        local_21 = 1;
        _iIndex->mRotationType = TRACK;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_BEZIER_ROT_KEY",0x16);
      if (bVar1) {
        local_21 = 1;
        _iIndex->mRotationType = BEZIER;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"CONTROL_TCB_ROT_KEY",0x13);
      if (bVar1) {
        local_21 = 1;
        _iIndex->mRotationType = TCB;
      }
      if ((local_21 & 1) != 0) {
        this_00 = &_iIndex->akeyRotations;
        aiQuatKey::aiQuatKey((aiQuatKey *)&key);
        std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::push_back(this_00,(aiQuatKey *)&key);
        v._4_8_ = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::back(&_iIndex->akeyRotations);
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)auStack_54);
        ParseLV4MeshFloatTriple(this,(ai_real *)auStack_54,&local_20);
        ParseLV4MeshFloat(this,&local_58);
        *(double *)v._4_8_ = (double)local_20;
        axis.z = v.x;
        axis.x = (float)auStack_54;
        axis.y = f;
        aiQuaterniont<float>::aiQuaterniont(&local_68,axis,local_58);
        *(undefined8 *)(v._4_8_ + 8) = local_68._0_8_;
        *(undefined8 *)(v._4_8_ + 0x10) = local_68._8_8_;
      }
    }
    if (*this->filePtr == '{') {
      iStack_1c = iStack_1c + 1;
    }
    else if (*this->filePtr == '}') {
      iStack_1c = iStack_1c + -1;
      if (iStack_1c == 0) {
        this->filePtr = this->filePtr + 1;
        SkipToNextToken(this);
        return;
      }
    }
    else if (*this->filePtr == '\0') {
      LogError(this,"Encountered unexpected EOL while parsing a *CONTROL_ROT_TRACK chunk (Level 3)")
      ;
    }
    bVar1 = IsLineEnd<char>(*this->filePtr);
    if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
      this->iLineNumber = this->iLineNumber + 1;
      this->bLastWasEndLine = true;
    }
    else {
      this->bLastWasEndLine = false;
    }
    this->filePtr = this->filePtr + 1;
  } while( true );
}

Assistant:

void Parser::ParseLV3RotAnimationBlock(ASE::Animation& anim)
{
    AI_ASE_PARSER_INIT();
    unsigned int iIndex;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            bool b = false;

            // For the moment we're just reading the  floats -
            // we ignore the additional information for bezier's and TCBs

            // simple scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_ROT_SAMPLE" ,18))
            {
                b = true;
                anim.mRotationType = ASE::Animation::TRACK;
            }

            // Bezier scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_BEZIER_ROT_KEY" ,22))
            {
                b = true;
                anim.mRotationType = ASE::Animation::BEZIER;
            }
            // TCB scaling keyframe
            if (TokenMatch(filePtr,"CONTROL_TCB_ROT_KEY" ,19))
            {
                b = true;
                anim.mRotationType = ASE::Animation::TCB;
            }
            if (b)
            {
                anim.akeyRotations.push_back(aiQuatKey());
                aiQuatKey& key = anim.akeyRotations.back();
                aiVector3D v;ai_real f;
                ParseLV4MeshFloatTriple(&v.x,iIndex);
                ParseLV4MeshFloat(f);
                key.mTime = (double)iIndex;
                key.mValue = aiQuaternion(v,f);
            }
        }
        AI_ASE_HANDLE_SECTION("3","*CONTROL_ROT_TRACK");
    }
}